

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O2

ion_err_t ion_fseek(ion_file_handle_t file,ion_file_offset_t seek_to,int origin)

{
  ion_err_t iVar1;
  int iVar2;
  
  iVar2 = fseek((FILE *)file,seek_to,origin);
  iVar1 = (ion_err_t)iVar2;
  if (iVar2 != 0) {
    iVar1 = '\r';
  }
  return iVar1;
}

Assistant:

ion_err_t
ion_fseek(
	ion_file_handle_t	file,
	ion_file_offset_t	seek_to,
	int					origin
) {
#if defined(ARDUINO)

	if (0 != fseek(file.file, seek_to, origin)) {
		return err_file_bad_seek;
	}

	return err_ok;
#else

	if (0 != fseek(file, seek_to, origin)) {
		return err_file_bad_seek;
	}

	return err_ok;
#endif
}